

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRMatrixUtil.cpp
# Opt level: O0

void ZXing::QRCode::BuildMatrix
               (BitArray *dataBits,ErrorCorrectionLevel ecLevel,Version *version,int maskPattern,
               TritMatrix *matrix)

{
  undefined4 in_ECX;
  undefined4 in_ESI;
  Matrix<ZXing::Trit> *in_R8;
  undefined4 in_stack_00000018;
  TritMatrix *in_stack_000000b8;
  int in_stack_000000c0;
  ErrorCorrectionLevel in_stack_000000c4;
  int in_stack_000000cc;
  BitArray *in_stack_000000d0;
  TritMatrix *in_stack_ffffffffffffffd0;
  value_t value;
  undefined4 in_stack_fffffffffffffff0;
  
  value.value = (value_t)((uint)in_ECX >> 0x18);
  memset(&stack0xffffffffffffffd7,0,1);
  Trit::Trit((Trit *)&stack0xffffffffffffffd7);
  Matrix<ZXing::Trit>::clear(in_R8,value);
  EmbedPositionDetectionPatternsAndSeparators((TritMatrix *)0x302fc7);
  EmbedDarkDotAtLeftBottomCorner(in_stack_ffffffffffffffd0);
  EmbedPositionAdjustmentPatterns(version,(TritMatrix *)CONCAT44(maskPattern,in_stack_00000018));
  EmbedTimingPatterns((TritMatrix *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  EmbedTypeInfo(in_stack_000000c4,in_stack_000000c0,in_stack_000000b8);
  EmbedVersionInfo(version,(TritMatrix *)CONCAT44(maskPattern,in_stack_00000018));
  EmbedDataBits(in_stack_000000d0,in_stack_000000cc,
                (TritMatrix *)CONCAT44(in_stack_000000c4,in_stack_000000c0));
  return;
}

Assistant:

void BuildMatrix(const BitArray& dataBits, ErrorCorrectionLevel ecLevel, const Version& version, int maskPattern, TritMatrix& matrix)
{
	matrix.clear();
	// Let's get started with embedding big squares at corners.
	EmbedPositionDetectionPatternsAndSeparators(matrix);
	// Then, embed the dark dot at the left bottom corner.
	EmbedDarkDotAtLeftBottomCorner(matrix);
	// Position adjustment patterns appear if version >= 2.
	EmbedPositionAdjustmentPatterns(version, matrix);
	// Timing patterns should be embedded after position adj. patterns.
	EmbedTimingPatterns(matrix);
	// Type information appear with any version.
	EmbedTypeInfo(ecLevel, maskPattern, matrix);
	// Version info appear if version >= 7.
	EmbedVersionInfo(version, matrix);
	// Data should be embedded at end.
	EmbedDataBits(dataBits, maskPattern, matrix);
}